

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void __thiscall
embree::SceneGraph::SubdivMeshNode::calculateStatistics(SubdivMeshNode *this,Statistics *stat)

{
  size_t sVar1;
  pointer pvVar2;
  MaterialNode *pMVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  sVar1 = (this->super_Node).indegree;
  (this->super_Node).indegree = sVar1 + 1;
  if (sVar1 != 0) {
    return;
  }
  stat->numSubdivMeshes = stat->numSubdivMeshes + 1;
  iVar4 = (*(this->super_Node).super_RefCount._vptr_RefCount[0xe])();
  stat->numPatches = stat->numPatches + CONCAT44(extraout_var,iVar4);
  iVar4 = (*(this->super_Node).super_RefCount._vptr_RefCount[0xe])(this);
  pvVar2 = (this->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  stat->numSubdivBytes =
       ((long)(this->position_indices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish +
        (CONCAT44(extraout_var_00,iVar4) * 4 -
        (long)(this->position_indices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) & 0xfffffffffffffffcU) + stat->numSubdivBytes +
       ((long)(this->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 5) * pvVar2->size_active
       * 0x10;
  pMVar3 = (this->material).ptr;
  (*(pMVar3->super_Node).super_RefCount._vptr_RefCount[9])(pMVar3,stat);
  return;
}

Assistant:

void SceneGraph::SubdivMeshNode::calculateStatistics(Statistics& stat)
  {
    indegree++;
    if (indegree == 1) {
      stat.numSubdivMeshes++;
      stat.numPatches += numPrimitives();
      stat.numSubdivBytes += numBytes();
      material->calculateStatistics(stat);
    }
  }